

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListenThread.cpp
# Opt level: O1

PTR brynet::net::ListenThread::Create(void)

{
  ListenThread *this;
  pointer pcVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *in_RDI;
  PTR PVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  peVar2 = (element_type *)operator_new(0xa0);
  (peVar2->super_enable_shared_from_this<brynet::net::ListenThread>)._M_weak_this.
  super___weak_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar2->_vptr_ListenThread = (_func_int **)&PTR___Sp_counted_ptr_inplace_00148158;
  this = (ListenThread *)
         &(peVar2->super_enable_shared_from_this<brynet::net::ListenThread>)._M_weak_this.
          super___weak_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  memset(this,0,0x90);
  ListenThread(this);
  (peVar2->super_enable_shared_from_this<brynet::net::ListenThread>)._M_weak_this.
  super___weak_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__ListenThread_001481a8;
  pcVar1 = (peVar2->mIP)._M_dataplus._M_p;
  local_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar2;
  if ((pcVar1 == (pointer)0x0) || (_Var3._M_pi = extraout_RDX, *(int *)(pcVar1 + 8) == 0)) {
    *(ListenThread **)&peVar2->mIsIPV6 = this;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&peVar2->mIP,&local_20);
    _Var3._M_pi = extraout_RDX_00;
  }
  in_RDI->_vptr_ListenThread = (_func_int **)this;
  (in_RDI->super_enable_shared_from_this<brynet::net::ListenThread>)._M_weak_this.
  super___weak_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (in_RDI->super_enable_shared_from_this<brynet::net::ListenThread>)._M_weak_this.
  super___weak_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_20._M_pi;
  PVar4.super___shared_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var3._M_pi;
  PVar4.super___shared_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (PTR)PVar4.super___shared_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ListenThread::PTR ListenThread::Create()
{
    struct make_shared_enabler : public ListenThread {};
    return std::make_shared<make_shared_enabler>();
}